

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall wasm::analysis::CFGBlockIndexes::CFGBlockIndexes(CFGBlockIndexes *this,CFG *cfg)

{
  mapped_type mVar1;
  pointer ppEVar2;
  mapped_type *pmVar3;
  pointer ppEVar4;
  BasicBlock *block;
  pointer pBVar5;
  Expression *local_40;
  Expression *expr;
  
  (this->map)._M_h._M_buckets = &(this->map)._M_h._M_single_bucket;
  (this->map)._M_h._M_bucket_count = 1;
  (this->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map)._M_h._M_element_count = 0;
  (this->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  expr = (Expression *)
         (cfg->blocks).
         super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  for (pBVar5 = (cfg->blocks).
                super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar5 != (pointer)expr;
      pBVar5 = pBVar5 + 1) {
    ppEVar2 = *(pointer *)
               ((long)&(pBVar5->insts).
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> +
               8);
    for (ppEVar4 = (pBVar5->insts).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar2;
        ppEVar4 = ppEVar4 + 1) {
      local_40 = *ppEVar4;
      mVar1 = pBVar5->index;
      pmVar3 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_40);
      *pmVar3 = mVar1;
    }
  }
  return;
}

Assistant:

CFGBlockIndexes::CFGBlockIndexes(const CFG& cfg) {
  for (auto& block : cfg) {
    for (auto* expr : block) {
      map[expr] = block.getIndex();
    }
  }
}